

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O0

int MPIABI_Bsend_init(void *buf,int count,MPIABI_Datatype datatype,int dest,int tag,MPIABI_Comm comm
                     ,MPIABI_Request *request)

{
  int iVar1;
  int iVar2;
  ompi_datatype_t *poVar3;
  ompi_communicator_t *poVar4;
  ompi_request_t **ppoVar5;
  WPI_HandlePtr<ompi_request_t_*> local_48;
  WPI_Handle local_40 [8];
  WPI_Handle local_38 [8];
  MPIABI_Comm local_30;
  MPIABI_Comm comm_local;
  int tag_local;
  int dest_local;
  MPIABI_Datatype datatype_local;
  void *pvStack_10;
  int count_local;
  void *buf_local;
  
  local_30 = comm;
  comm_local._0_4_ = tag;
  comm_local._4_4_ = dest;
  _tag_local = datatype;
  datatype_local._4_4_ = count;
  pvStack_10 = buf;
  WPI_Handle<ompi_datatype_t_*>::WPI_Handle((WPI_Handle<ompi_datatype_t_*> *)local_38,datatype);
  poVar3 = WPI_Handle::operator_cast_to_ompi_datatype_t_(local_38);
  iVar1 = comm_local._4_4_;
  iVar2 = (int)comm_local;
  WPI_Handle<ompi_communicator_t_*>::WPI_Handle
            ((WPI_Handle<ompi_communicator_t_*> *)local_40,local_30);
  poVar4 = WPI_Handle::operator_cast_to_ompi_communicator_t_(local_40);
  WPI_HandlePtr<ompi_request_t_*>::WPI_HandlePtr(&local_48,request);
  ppoVar5 = WPI_HandlePtr::operator_cast_to_ompi_request_t__((WPI_HandlePtr *)&local_48);
  iVar2 = MPI_Bsend_init(buf,count,poVar3,iVar1,iVar2,poVar4,ppoVar5);
  WPI_HandlePtr<ompi_request_t_*>::~WPI_HandlePtr(&local_48);
  return iVar2;
}

Assistant:

int MPIABI_Bsend_init(
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  int dest,
  int tag,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Bsend_init(
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    dest,
    tag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}